

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>::
AdapterPromiseNode<kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char>,unsigned_long&>
          (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead> *this
          ,AsyncPipe *params,ArrayPtr<unsigned_char> *params_1,unsigned_long *params_2)

{
  ArrayPtr<unsigned_char> readBuffer;
  AsyncPipe *pipe;
  ArrayPtr<unsigned_char> *pAVar1;
  unsigned_long *puVar2;
  unsigned_long *params_local_2;
  ArrayPtr<unsigned_char> *params_local_1;
  AsyncPipe *params_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_long>::PromiseFulfiller
            ((PromiseFulfiller<unsigned_long> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007d9ee8;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007d9f30;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)(this + 0x18));
  this[0x188] = (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
                )0x1;
  pipe = fwd<kj::(anonymous_namespace)::AsyncPipe&>(params);
  pAVar1 = fwd<kj::ArrayPtr<unsigned_char>>(params_1);
  readBuffer = *pAVar1;
  puVar2 = fwd<unsigned_long&>(params_2);
  anon_unknown_77::AsyncPipe::BlockedRead::BlockedRead
            ((BlockedRead *)(this + 400),(PromiseFulfiller<unsigned_int> *)(this + 0x10),pipe,
             readBuffer,*puVar2);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}